

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Arena *pAVar2;
  Cord *output;
  char *message;
  char *in_R9;
  pointer pcVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_308;
  internal local_300 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  AssertHelper local_2f0;
  string local_2e8;
  undefined1 local_2c8 [528];
  ArenaStringPtr local_b8;
  ArenaStringPtr local_b0 [7];
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined8 local_34;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2c8,(Arena *)0x0);
  output = &(this->super_NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>).value_;
  local_300[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2c8,output);
  local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_300[0]) {
    local_2f0.data_._0_4_ = 0;
    absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
    local_308._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_2e8._M_string_length;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_300,"0","this->GetOutput().size()",(int *)&local_2f0,
               (unsigned_long *)&local_308);
    paVar1 = &local_2e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_300[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_2e8);
      if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = (local_2f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x455,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
      if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
      }
    }
    if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,local_2f8);
    }
    local_b0[6].tagged_ptr_.ptr_ = (TaggedStringPtr)(void *)0x0;
    _uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0.0;
    local_38 = false;
    local_2c8._16_4_ = local_2c8._16_4_ | 0x1fff01;
    pAVar2 = (Arena *)local_2c8._8_8_;
    if ((local_2c8._8_8_ & 1) != 0) {
      pAVar2 = *(Arena **)(local_2c8._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(local_2c8 + 0x208),(string_view)(ZEXT816(0x10f75f1) << 0x40),
               pAVar2);
    local_2c8._16_4_ = local_2c8._16_4_ | 2;
    pAVar2 = (Arena *)local_2c8._8_8_;
    if ((local_2c8._8_8_ & 1) != 0) {
      pAVar2 = *(Arena **)(local_2c8._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&local_b8,(string_view)(ZEXT816(0x10f75f1) << 0x40),pAVar2);
    local_34 = 0;
    local_2c8._16_4_ = local_2c8._16_4_ | 0x600004;
    if ((local_2c8._8_8_ & 1) != 0) {
      local_2c8._8_8_ = *(undefined8 *)(local_2c8._8_8_ & 0xfffffffffffffffe);
    }
    pcVar3 = anon_var_dwarf_a22956 + 5;
    protobuf::internal::ArenaStringPtr::Set
              (local_b0,(string_view)(ZEXT816(0x10f75f1) << 0x40),(Arena *)local_2c8._8_8_);
    local_300[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2c8,output);
    local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_300[0]) {
      local_2f0.data_._0_4_ = 0;
      absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
      local_308._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_2e8._M_string_length;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_300,"0","this->GetOutput().size()",(int *)&local_2f0,
                 (unsigned_long *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (local_300[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_2e8);
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_2f8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_308,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
        if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      uStack_78 = 1;
      local_2c8._16_4_ = local_2c8._16_4_ | 0x200;
      local_300[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2c8,output);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_300[0]) {
        local_2f0.data_._0_4_ = 2;
        absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
        local_308._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2e8._M_string_length;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  (local_300,"2","this->GetOutput().size()",(int *)&local_2f0,
                   (unsigned_long *)&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_300[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2e8);
          if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = (local_2f8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_308,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x470,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_308,(Message *)&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
          if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
          }
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
        absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
        testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                  (local_300,"\"\\x08\\x01\"","this->GetOutput()",(char (*) [3])0x11355aa,&local_2e8
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_300[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2e8);
          if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = anon_var_dwarf_a22956 + 5;
          }
          else {
            message = (local_2f8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_308,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x471,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_308,(Message *)&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
          if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
          }
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
        _uStack_78 = _uStack_78 & 0xffffffff00000000;
        local_2c8._16_4_ = local_2c8._16_4_ | 0x200;
        local_300[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2c8,output);
        local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_300[0]) {
          local_2f0.data_._0_4_ = 0;
          absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
          local_308._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2e8._M_string_length;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    (local_300,"0","this->GetOutput().size()",(int *)&local_2f0,
                     (unsigned_long *)&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          if (local_300[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_2e8);
            if (local_2f8 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar3 = (local_2f8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_308,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                       ,0x475,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_308,(Message *)&local_2e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
            if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
            }
          }
          goto joined_r0x008c049d;
        }
        testing::Message::Message((Message *)&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2e8,local_300,(AssertionResult *)"TestSerialize(message, &output_sink)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x474,local_2e8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
      }
      else {
        testing::Message::Message((Message *)&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2e8,local_300,(AssertionResult *)"TestSerialize(message, &output_sink)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46f,local_2e8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
      }
    }
    else {
      testing::Message::Message((Message *)&local_308);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2e8,local_300,(AssertionResult *)"TestSerialize(message, &output_sink)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x46b,local_2e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
LAB_008c0479:
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e8,local_300,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x454,local_2e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) goto LAB_008c0479;
  }
  if (local_308._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_308._M_head_impl + 8))();
  }
joined_r0x008c049d:
  if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f8,local_2f8);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2c8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, DontSerializeDefaultValuesTest) {
  // check that serialized data contains only non-zero numeric fields/non-empty
  // string/byte fields.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  // Zero values -> still no output.
  message.set_optional_int32(0);
  message.set_optional_int64(0);
  message.set_optional_uint32(0);
  message.set_optional_uint64(0);
  message.set_optional_sint32(0);
  message.set_optional_sint64(0);
  message.set_optional_fixed32(0);
  message.set_optional_fixed64(0);
  message.set_optional_sfixed32(0);
  message.set_optional_sfixed64(0);
  message.set_optional_float(0);
  message.set_optional_double(0);
  message.set_optional_bool(false);
  message.set_optional_string("");
  message.set_optional_bytes("");
  message.set_optional_nested_enum(TestAllTypes::FOO);  // first enum entry
  message.set_optional_foreign_enum(FOREIGN_FOO);       // first enum entry
  message.set_optional_string_piece("");

  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  message.set_optional_int32(1);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(2, this->GetOutput().size());
  EXPECT_EQ("\x08\x01", this->GetOutput());

  message.set_optional_int32(0);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());
}